

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitDestructuredArrayCore
               (ParseNode *list,RegSlot iteratorLocation,RegSlot nextMethodReg,
               RegSlot shouldCallReturnFunctionLocation,
               RegSlot shouldCallReturnFunctionLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  code *pcVar1;
  OpCode OVar2;
  byte bVar3;
  bool bVar4;
  RegSlot resultReg;
  RegSlot value;
  uint uVar5;
  ByteCodeLabel BVar6;
  RegSlot value_00;
  ByteCodeLabel BVar7;
  RegSlot R0;
  ByteCodeWriter *this;
  ParseNodeBin *pPVar8;
  ParseNodeVar *pPVar9;
  undefined4 *puVar10;
  ParseNodePtr this_00;
  ParseNode *local_70;
  bool local_50;
  
  if (list == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1924,"(list != nullptr)","list != nullptr");
    if (!bVar4) {
LAB_0080d15b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar10 = 0;
  }
  else {
    this = &byteCodeGenerator->m_writer;
    do {
      OVar2 = list->nop;
      this_00 = list;
      if (OVar2 == knopList) {
        pPVar8 = ParseNode::AsParseNodeBin(list);
        this_00 = pPVar8->pnode1;
        OVar2 = this_00->nop;
      }
      if (OVar2 - 0x51 < 3) {
        pPVar9 = ParseNode::AsParseNodeVar(this_00);
        local_70 = pPVar9->pnodeInit;
      }
      else if (OVar2 == knopAsg) {
        pPVar8 = ParseNode::AsParseNodeBin(this_00);
        local_70 = pPVar8->pnode2;
        pPVar8 = ParseNode::AsParseNodeBin(this_00);
        this_00 = pPVar8->pnode1;
      }
      else {
        if (OVar2 == knopEllipsis) break;
        local_70 = (ParseNode *)0x0;
      }
      ByteCodeGenerator::StartStatement(byteCodeGenerator,this_00);
      bVar3 = this_00->nop + ~knopList;
      if ((bVar3 < 0x22) && ((0x280000007U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        local_50 = false;
      }
      else {
        Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
        Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
        EmitReference(this_00,byteCodeGenerator,funcInfo);
        local_50 = true;
      }
      Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
      Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
      resultReg = FuncInfo::AcquireTmpRegister(funcInfo);
      EmitFunctionCall(resultReg,nextMethodReg,iteratorLocation,0xffffffff,byteCodeGenerator,
                       funcInfo);
      EmitThrowOnNotObject(resultReg,byteCodeGenerator);
      value = FuncInfo::AcquireTmpRegister(funcInfo);
      uVar5 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x74,false,false);
      Js::ByteCodeWriter::PatchableProperty(this,LdFld,value,resultReg,uVar5,false,false);
      if (this_00->nop == knopEmpty) {
        if (list->nop != knopList) {
          if (list->nop != knopEmpty) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1976,"(list->nop == knopEmpty)","list->nop == knopEmpty");
            if (!bVar4) goto LAB_0080d15b;
            *puVar10 = 0;
          }
          EmitIteratorCloseIfNotDone(iteratorLocation,value,byteCodeGenerator,funcInfo);
          FuncInfo::ReleaseTmpRegister(funcInfo,value);
          FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
          break;
        }
        pPVar8 = ParseNode::AsParseNodeBin(list);
        list = pPVar8->pnode2;
        FuncInfo::ReleaseTmpRegister(funcInfo,value);
        FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
      }
      else {
        BVar6 = Js::ByteCodeWriter::DefineLabel(this);
        Js::ByteCodeWriter::BrReg1(this,BrTrue_A,BVar6,value);
        value_00 = FuncInfo::AcquireTmpRegister(funcInfo);
        uVar5 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x197,false,false);
        Js::ByteCodeWriter::PatchableProperty(this,LdFld,value_00,resultReg,uVar5,false,false);
        BVar7 = Js::ByteCodeWriter::DefineLabel(this);
        Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
        Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
        Js::ByteCodeWriter::Br(this,BVar7);
        Js::ByteCodeWriter::MarkLabel(this,BVar6);
        Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,value_00,funcInfo->undefinedConstantRegister);
        Js::ByteCodeWriter::MarkLabel(this,BVar7);
        if ((this_00->nop & ~knopInt) == knopObjectPattern) {
          if (local_70 == (ParseNode *)0x0) {
            if (this_00->nop == knopObjectPattern) {
              EmitDestructuredObject(this_00,value_00,byteCodeGenerator,funcInfo);
            }
            else {
              EmitDestructuredArray(this_00,value_00,byteCodeGenerator,funcInfo);
            }
          }
          else {
            R0 = FuncInfo::AcquireTmpRegister(funcInfo);
            ByteCodeGenerator::StartStatement(byteCodeGenerator,local_70);
            BVar6 = Js::ByteCodeWriter::DefineLabel(this);
            BVar7 = Js::ByteCodeWriter::DefineLabel(this);
            Js::ByteCodeWriter::BrReg2
                      (this,BrSrNeq_A,BVar6,value_00,funcInfo->undefinedConstantRegister);
            Emit(local_70,byteCodeGenerator,funcInfo,0,false,false);
            Js::ByteCodeWriter::Reg2(this,Ld_A,R0,local_70->location);
            FuncInfo::ReleaseLoc(funcInfo,local_70);
            Js::ByteCodeWriter::Br(this,BVar7);
            Js::ByteCodeWriter::MarkLabel(this,BVar6);
            Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,R0,value_00);
            Js::ByteCodeWriter::MarkLabel(this,BVar7);
            Js::ByteCodeWriter::EndStatement(this,local_70);
            if (this_00->nop == knopObjectPattern) {
              EmitDestructuredObject(this_00,R0,byteCodeGenerator,funcInfo);
            }
            else {
              EmitDestructuredArray(this_00,R0,byteCodeGenerator,funcInfo);
            }
            FuncInfo::ReleaseTmpRegister(funcInfo,R0);
          }
        }
        else {
          EmitDestructuredValueOrInitializer
                    (this_00,value_00,local_70,local_50,byteCodeGenerator,funcInfo);
        }
        Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
        Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
        if (list->nop != knopList) {
          EmitIteratorCloseIfNotDone(iteratorLocation,value,byteCodeGenerator,funcInfo);
        }
        FuncInfo::ReleaseTmpRegister(funcInfo,value_00);
        FuncInfo::ReleaseTmpRegister(funcInfo,value);
        FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
        if (local_50 != false) {
          FuncInfo::ReleaseReference(funcInfo,this_00);
        }
        Js::ByteCodeWriter::EndStatement(this,this_00);
        if (list->nop != knopList) break;
        pPVar8 = ParseNode::AsParseNodeBin(list);
        list = pPVar8->pnode2;
      }
    } while (list != (ParseNodePtr)0x0);
    if (this_00->nop == knopEllipsis) {
      EmitDestructuredRestArray
                (this_00,iteratorLocation,nextMethodReg,shouldCallReturnFunctionLocation,
                 shouldCallReturnFunctionLocationFinally,byteCodeGenerator,funcInfo);
      return;
    }
  }
  return;
}

Assistant:

void EmitDestructuredArrayCore(
    ParseNode* list,
    Js::RegSlot iteratorLocation,
    Js::RegSlot nextMethodReg,
    Js::RegSlot shouldCallReturnFunctionLocation,
    Js::RegSlot shouldCallReturnFunctionLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Assert(list != nullptr);

    ParseNode *elem = nullptr;
    while (list != nullptr)
    {
        ParseNode *init = nullptr;

        if (list->nop == knopList)
        {
            elem = list->AsParseNodeBin()->pnode1;
        }
        else
        {
            elem = list;
        }

        if (elem->nop == knopEllipsis)
        {
            break;
        }

        switch (elem->nop)
        {
        case knopAsg:
            // An assignment node will always have an initializer
            init = elem->AsParseNodeBin()->pnode2;
            elem = elem->AsParseNodeBin()->pnode1;
            break;

        case knopVarDecl:
        case knopLetDecl:
        case knopConstDecl:
            init = elem->AsParseNodeVar()->pnodeInit;
            break;

        default:
            break;
        }

        byteCodeGenerator->StartStatement(elem);

        bool isAssignmentTarget = !(elem->IsPattern() || elem->IsVarLetOrConst());

        if (isAssignmentTarget)
        {
            byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
            byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
            EmitReference(elem, byteCodeGenerator, funcInfo);
        }

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

        Js::RegSlot itemLocation = funcInfo->AcquireTmpRegister();
        EmitFunctionCall(
            itemLocation,
            nextMethodReg,
            iteratorLocation,
            byteCodeGenerator,
            funcInfo);

        EmitThrowOnNotObject(itemLocation, byteCodeGenerator);

        Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
        EmitGetObjectProperty(
            doneLocation,
            itemLocation,
            Js::PropertyIds::done,
            byteCodeGenerator,
            funcInfo);

        if (elem->nop == knopEmpty)
        {
            if (list->nop == knopList)
            {
                list = list->AsParseNodeBin()->pnode2;
                funcInfo->ReleaseTmpRegister(doneLocation);
                funcInfo->ReleaseTmpRegister(itemLocation);
                continue;
            }
            else
            {
                Assert(list->nop == knopEmpty);
                EmitIteratorCloseIfNotDone(iteratorLocation, doneLocation, byteCodeGenerator, funcInfo);
                funcInfo->ReleaseTmpRegister(doneLocation);
                funcInfo->ReleaseTmpRegister(itemLocation);
                break;
            }
        }

        // If the iterator hasn't completed, skip assigning undefined.
        Js::ByteCodeLabel iteratorAlreadyDone = byteCodeGenerator->Writer()->DefineLabel();
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, iteratorAlreadyDone, doneLocation);

        // We're not done with the iterator, so assign the .next() value.
        Js::RegSlot valueLocation = funcInfo->AcquireTmpRegister();
        EmitGetObjectProperty(
            valueLocation,
            itemLocation,
            Js::PropertyIds::value,
            byteCodeGenerator,
            funcInfo);

        Js::ByteCodeLabel beforeDefaultAssign = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
        byteCodeGenerator->Writer()->Br(beforeDefaultAssign);

        // iteratorAlreadyDone:
        byteCodeGenerator->Writer()->MarkLabel(iteratorAlreadyDone);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueLocation, funcInfo->undefinedConstantRegister);

        // beforeDefaultAssign:
        byteCodeGenerator->Writer()->MarkLabel(beforeDefaultAssign);

        if (elem->IsPattern())
        {
            // If we get an undefined value and have an initializer, use it in place of undefined.
            if (init != nullptr)
            {
                /*
                the IR builder uses two symbols for a temp register in the if else path
                R9 <- R3
                if (...)
                R9 <- R2
                R10 = R9.<property>  // error -> IR creates a new lifetime for the if path, and the direct path dest is not referenced
                hence we have to create a new temp

                TEMP REG USED TO FIX THIS PRODUCES THIS
                R9 <- R3
                if (BrEq_A R9, R3)
                R10 <- R2               :
                else
                R10 <- R9               : skipdefault
                ...  = R10[@@iterator]  : loadIter
                */

                // Temp Register
                Js::RegSlot valueLocationTmp = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->StartStatement(init);

                Js::ByteCodeLabel skipDefault = byteCodeGenerator->Writer()->DefineLabel();
                Js::ByteCodeLabel loadIter = byteCodeGenerator->Writer()->DefineLabel();

                // check value is undefined
                byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrSrNeq_A, skipDefault, valueLocation, funcInfo->undefinedConstantRegister);

                // Evaluate the default expression and assign it.
                Emit(init, byteCodeGenerator, funcInfo, false);
                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, valueLocationTmp, init->location);
                funcInfo->ReleaseLoc(init);

                // jmp to loadIter
                byteCodeGenerator->Writer()->Br(loadIter);

                // skipDefault:
                byteCodeGenerator->Writer()->MarkLabel(skipDefault);
                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueLocationTmp, valueLocation);

                // loadIter:
                // @@iterator
                byteCodeGenerator->Writer()->MarkLabel(loadIter);
                byteCodeGenerator->EndStatement(init);

                if (elem->nop == knopObjectPattern)
                {
                    EmitDestructuredObject(elem, valueLocationTmp, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // Recursively emit a destructured array using the current .next() as the RHS.
                    EmitDestructuredArray(elem, valueLocationTmp, byteCodeGenerator, funcInfo);
                }

                funcInfo->ReleaseTmpRegister(valueLocationTmp);
            }
            else
            {
                if (elem->nop == knopObjectPattern)
                {
                    EmitDestructuredObject(elem, valueLocation, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // Recursively emit a destructured array using the current .next() as the RHS.
                    EmitDestructuredArray(elem, valueLocation, byteCodeGenerator, funcInfo);
                }
            }
        }
        else
        {
            EmitDestructuredValueOrInitializer(elem, valueLocation, init, isAssignmentTarget, byteCodeGenerator, funcInfo);
        }

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

        if (list->nop != knopList)
        {
            EmitIteratorCloseIfNotDone(iteratorLocation, doneLocation, byteCodeGenerator, funcInfo);
        }

        funcInfo->ReleaseTmpRegister(valueLocation);
        funcInfo->ReleaseTmpRegister(doneLocation);
        funcInfo->ReleaseTmpRegister(itemLocation);

        if (isAssignmentTarget)
        {
            funcInfo->ReleaseReference(elem);
        }

        byteCodeGenerator->EndStatement(elem);

        if (list->nop == knopList)
        {
            list = list->AsParseNodeBin()->pnode2;
        }
        else
        {
            break;
        }
    }

    // If we saw a rest element, emit the rest array.
    if (elem != nullptr && elem->nop == knopEllipsis)
    {
        EmitDestructuredRestArray(
            elem,
            iteratorLocation,
            nextMethodReg,
            shouldCallReturnFunctionLocation,
            shouldCallReturnFunctionLocationFinally,
            byteCodeGenerator,
            funcInfo);
    }
}